

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulation.cpp
# Opt level: O2

void __thiscall Simulation::initSimulationRendering(Simulation *this)

{
  Renderer *this_00;
  uint16_t uVar1;
  initializer_list<float> __l;
  initializer_list<float> __l_00;
  initializer_list<float> __l_01;
  initializer_list<float> __l_02;
  undefined1 local_3f8 [8];
  Material materialVec;
  Material materialGrid;
  Material materialGridBorder;
  Material material;
  Shader local_1a8;
  Shader local_158;
  Shader local_108;
  string local_b8;
  undefined4 local_98;
  undefined8 local_54;
  undefined8 uStack_4c;
  undefined8 local_44;
  undefined8 uStack_3c;
  undefined4 local_34;
  allocator_type local_21;
  
  uVar1 = Config::dim;
  local_108._vertPath._M_dataplus._M_p = (pointer)&local_108._vertPath.field_2;
  local_108._id = 0;
  local_108._4_4_ = 0;
  local_108._vertPath._M_string_length = 0;
  local_108._fragPath.field_2._8_8_ = 0;
  local_108._vertPath.field_2._8_8_ = 0;
  local_108._fragPath._M_string_length = 0;
  local_108._vertPath.field_2._M_allocated_capacity = 0;
  local_108._fragPath._M_dataplus._M_p = (pointer)&local_108._fragPath.field_2;
  local_108._fragPath.field_2._M_allocated_capacity = 0;
  (this->_fluidRenderer).mesh.dim = Config::dim;
  if (uVar1 == 2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"shaders/vert2D.vert",
               (allocator<char> *)
               &materialGridBorder.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Shader::setVert(&local_108,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"shaders/fluid2D.frag",
               (allocator<char> *)
               &materialGridBorder.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Shader::setFrag(&local_108,&local_b8);
LAB_0011d98f:
    std::__cxx11::string::~string((string *)&local_b8);
  }
  else if (uVar1 == 3) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"shaders/vert.vert",
               (allocator<char> *)
               &materialGridBorder.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Shader::setVert(&local_108,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b8,"shaders/fluid3D.frag",
               (allocator<char> *)
               &materialGridBorder.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    Shader::setFrag(&local_108,&local_b8);
    goto LAB_0011d98f;
  }
  Shader::Shader((Shader *)
                 &materialGridBorder.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,&local_108);
  material.shader._fragPath.field_2._8_2_ = Config::dim;
  material.shader._fragPath.field_2._10_2_ = 1;
  material._68_8_ = 0x3f80000042c80000;
  material.absorption = 1.0;
  material.lightIntensity.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  material.lightIntensity.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  material.lightIntensity.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  local_b8.field_2._M_allocated_capacity = 0;
  local_b8.field_2._8_8_ = 0x3f80000000000000;
  local_b8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_b8._M_string_length = 0x3f800000;
  __l._M_len = 8;
  __l._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&material.TBO,__l,(allocator_type *)local_3f8)
  ;
  Material::operator=(&(this->_fluidRenderer).material,
                      (Material *)
                      &materialGridBorder.texCoords.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  this_00 = &this->_renderer;
  Renderer::initMaterial
            (this_00,(Material *)
                     &materialGridBorder.texCoords.super__Vector_base<float,_std::allocator<float>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Renderer::initMesh(this_00,&(this->_fluidRenderer).mesh);
  material.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"shaders/vert.vert",(allocator<char> *)local_3f8);
  Shader::setVert((Shader *)
                  &material.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"shaders/vec.frag",(allocator<char> *)local_3f8);
  Shader::setFrag((Shader *)
                  &material.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  Shader::Shader((Shader *)local_3f8,
                 (Shader *)
                 &material.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
  materialVec.shader._fragPath.field_2._8_4_ = 2;
  materialVec._68_8_ = 0x3f80000042c80000;
  materialVec.absorption = 1.0;
  materialVec.lightIntensity.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  materialVec.lightIntensity.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  materialVec.lightIntensity.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  local_b8.field_2._M_allocated_capacity = 0;
  local_b8.field_2._8_8_ = 0x3f80000000000000;
  local_b8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_b8._M_string_length = 0x3f800000;
  __l_00._M_len = 8;
  __l_00._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&materialVec.TBO,__l_00,
             (allocator_type *)
             &materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Material::operator=(&(this->_fluidRenderer).materialVec,(Material *)local_3f8);
  Renderer::initMaterial(this_00,(Material *)local_3f8);
  local_1a8._vertPath._M_dataplus._M_p = (pointer)&local_1a8._vertPath.field_2;
  local_1a8._id = 0;
  local_1a8._4_4_ = 0;
  local_1a8._vertPath._M_string_length = 0;
  local_1a8._fragPath.field_2._8_8_ = 0;
  local_1a8._vertPath.field_2._8_8_ = 0;
  local_1a8._fragPath._M_string_length = 0;
  local_1a8._vertPath.field_2._M_allocated_capacity = 0;
  local_1a8._fragPath._M_dataplus._M_p = (pointer)&local_1a8._fragPath.field_2;
  local_1a8._fragPath.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"shaders/vert.vert",
             (allocator<char> *)
             &materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Shader::setVert(&local_1a8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"shaders/grid.frag",
             (allocator<char> *)
             &materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Shader::setFrag(&local_1a8,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  Shader::Shader((Shader *)
                 &materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_1a8);
  materialGrid.shader._fragPath.field_2._8_4_ = 2;
  materialGrid._68_8_ = 0x3f80000042c80000;
  materialGrid.absorption = 1.0;
  materialGrid.lightIntensity.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  materialGrid.lightIntensity.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  materialGrid.lightIntensity.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  local_b8.field_2._M_allocated_capacity = 0;
  local_b8.field_2._8_8_ = 0x3f80000000000000;
  local_b8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_b8._M_string_length = 0x3f800000;
  __l_01._M_len = 8;
  __l_01._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&materialGrid.TBO,__l_01,
             (allocator_type *)
             &materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Material::operator=(&(this->_fluidRenderer).materialGrid,
                      (Material *)
                      &materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  Renderer::initMaterial
            (this_00,(Material *)
                     &materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  local_158._vertPath._M_dataplus._M_p = (pointer)&local_158._vertPath.field_2;
  local_158._id = 0;
  local_158._4_4_ = 0;
  local_158._vertPath._M_string_length = 0;
  local_158._fragPath.field_2._8_8_ = 0;
  local_158._vertPath.field_2._8_8_ = 0;
  local_158._fragPath._M_string_length = 0;
  local_158._vertPath.field_2._M_allocated_capacity = 0;
  local_158._fragPath._M_dataplus._M_p = (pointer)&local_158._fragPath.field_2;
  local_158._fragPath.field_2._M_allocated_capacity = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"shaders/vert.vert",
             (allocator<char> *)
             &materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Shader::setVert(&local_158,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"shaders/gridBorder.frag",
             (allocator<char> *)
             &materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  Shader::setFrag(&local_158,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  Shader::Shader((Shader *)
                 &materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,&local_158);
  materialGridBorder.shader._fragPath.field_2._8_4_ = 2;
  materialGridBorder._68_8_ = 0x3f80000042c80000;
  materialGridBorder.absorption = 1.0;
  materialGridBorder.lightIntensity.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x3f800000;
  materialGridBorder.lightIntensity.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  materialGridBorder.lightIntensity.field_2 =
       (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7)0x0;
  local_b8.field_2._M_allocated_capacity = 0;
  local_b8.field_2._8_8_ = 0x3f80000000000000;
  local_b8._M_dataplus._M_p = (pointer)0x3f8000003f800000;
  local_b8._M_string_length = 0x3f800000;
  __l_02._M_len = 8;
  __l_02._M_array = (iterator)&local_b8;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&materialGridBorder.TBO,__l_02,&local_21);
  Material::operator=(&(this->_fluidRenderer).materialGridBorder,
                      (Material *)
                      &materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  Renderer::initMaterial
            (this_00,(Material *)
                     &materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (Config::dim == 2) {
    local_b8._M_dataplus._M_p = (pointer)0xc2b40000c3870000;
    local_b8._M_string_length = 0x3f800000;
    local_b8.field_2._M_allocated_capacity = 0x3f80000000000000;
    local_b8.field_2._8_8_ = 0x3f80000000000000;
    local_98 = 0;
    glm::zero<glm::mat<4,4,float,(glm::qualifier)0>>();
    local_54 = 0x3f80000000000000;
    uStack_4c = 0;
  }
  else {
    if (Config::dim != 3) goto LAB_0011de5e;
    local_b8._M_dataplus._M_p = (pointer)0xc1f80000c40f0000;
    local_b8._M_string_length = 0x3f800000;
    local_b8.field_2._M_allocated_capacity = 0x3f80000000000000;
    local_b8.field_2._8_8_ = 0x3f80000000000000;
    local_98 = 0;
    glm::zero<glm::mat<4,4,float,(glm::qualifier)0>>();
    local_54 = 0x41163d71416d999a;
    uStack_4c = 0x42b40000c103851f;
  }
  uStack_3c = 0x3f8000003f800000;
  local_44 = 0;
  local_34 = 0x3f800000;
  memcpy(&this->_camera,&local_b8,0x88);
LAB_0011de5e:
  Material::~Material((Material *)
                      &materialGrid.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  Shader::~Shader(&local_158);
  Material::~Material((Material *)
                      &materialVec.texCoords.super__Vector_base<float,_std::allocator<float>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
  Shader::~Shader(&local_1a8);
  Material::~Material((Material *)local_3f8);
  Shader::~Shader((Shader *)
                  &material.texCoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  Material::~Material((Material *)
                      &materialGridBorder.texCoords.
                       super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage);
  Shader::~Shader(&local_108);
  return;
}

Assistant:

void Simulation::initSimulationRendering()
{
    Shader shaderProgram {};

    _fluidRenderer.mesh.dim = Config::dim;
    if (Config::dim == 3)
    {
        shaderProgram.setVert("shaders/vert.vert");
        shaderProgram.setFrag("shaders/fluid3D.frag");
    }
    else if (Config::dim == 2)
    {
        shaderProgram.setVert("shaders/vert2D.vert");
        shaderProgram.setFrag("shaders/fluid2D.frag");
    }
    Material material =
    {
        .shader = shaderProgram,
        .dim = Config::dim,
        .hasTexture = true,
        .texCoords =
        {
            1.0f, 1.0f,
            1.0f, 0.0f,
            0.0f, 0.0f,
            0.0f, 1.0f
        },
    };
    _fluidRenderer.material = material;
    _renderer.initMaterial(material);
    _renderer.initMesh(_fluidRenderer.mesh);

    Shader shaderProgramVec {};
    shaderProgramVec.setVert("shaders/vert.vert");
    shaderProgramVec.setFrag("shaders/vec.frag");
    Material materialVec =
    {
        .shader = shaderProgramVec,
        .texCoords =
        {
            1.0f, 1.0f,
            1.0f, 0.0f,
            0.0f, 0.0f,
            0.0f, 1.0f
        },
    };
    _fluidRenderer.materialVec = materialVec;
    _renderer.initMaterial(materialVec);

    Shader shaderProgramGrid {};
    shaderProgramGrid.setVert("shaders/vert.vert");
    shaderProgramGrid.setFrag("shaders/grid.frag");
    Material materialGrid =
    {
        .shader = shaderProgramGrid,
        .texCoords =
        {
            1.0f, 1.0f,
            1.0f, 0.0f,
            0.0f, 0.0f,
            0.0f, 1.0f
        },
    };
    _fluidRenderer.materialGrid = materialGrid;
    _renderer.initMaterial(materialGrid);

    Shader shaderProgramGridBorder {};
    shaderProgramGridBorder.setVert("shaders/vert.vert");
    shaderProgramGridBorder.setFrag("shaders/gridBorder.frag");
    Material materialGridBorder =
    {
        .shader = shaderProgramGridBorder,
        .texCoords =
        {
            1.0f, 1.0f,
            1.0f, 0.0f,
            0.0f, 0.0f,
            0.0f, 1.0f
        },
    };
    _fluidRenderer.materialGridBorder = materialGridBorder;
    _renderer.initMaterial(materialGridBorder);

    if (Config::dim == 3)
    {
        _camera =
        {
            .yaw = -572,
            .pitch = -31,
            .speed = 1,
            .transform = Transform
            {
                .position = {14.85, 9.39, -8.22},
                .rotation = {90, 0, 0},
                .scale = {1, 1, 1}
            },
        };
    }
    else if (Config::dim == 2)
    {
        _camera =
        {
            .yaw = -90-90-90,
            .pitch = -90,
            .speed = 1,
            .transform = Transform
            {
                .position = {0.0, 1.0, 0.0},
                .rotation = {0, 0, 0},
                .scale = {1, 1, 1}
            },
        };
    }
}